

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void IfStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  JsVm *pJVar1;
  JsAstNode *pJVar2;
  undefined1 local_80 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if ((pJVar1->debug == 1) && (pJVar1 = JsGetVm(), pJVar1->trace != (JsVmTraceFn)0x0)) {
    pJVar1 = JsGetVm();
    (*pJVar1->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
  }
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_80);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_80,res_00);
  JsToBoolean(res_00,(JsValue *)((long)&r2.u + 8));
  if (r3.type == JS_NULL) {
    pJVar2 = (JsAstNode *)na[1].location;
  }
  else {
    pJVar2 = *(JsAstNode **)(na + 2);
    if (pJVar2 == (JsAstNode *)0x0) {
      res->type = JS_COMPLETION;
      (res->u).completion.type = JS_COMPLETION_NORMAL;
      (res->u).number = 0.0;
      return;
    }
  }
  (*JsNodeClassEval[pJVar2->astClass])(pJVar2,context,res);
  return;
}

Assistant:

static void
IfStatement_eval(na, context, res)
	struct JsAstNode *na; /* (struct IfStatement_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstIfStatementNode *n = CAST_NODE(na, JsAstIfStatementNode);
	struct JsValue r1, r2, r3;

	TRACE(na->location, context, JS_TRACE_STATEMENT);
	EVAL(n->cond, context, &r1);
	JsGetValue( &r1, &r2);
	JsToBoolean(&r2, &r3);
	if (r3.u.boolean == TRUE)
		EVAL(n->btrue, context, res);
	else if (n->bfalse)
		EVAL(n->bfalse, context, res);
	else
		JS_SET_COMPLETION(res, JS_COMPLETION_NORMAL, NULL);
}